

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Direction.cpp
# Opt level: O0

Direction * __thiscall iDynTree::Direction::reverse(Direction *this)

{
  double in_RSI;
  Direction *in_RDI;
  Direction *unaff_retaddr;
  
  Direction(unaff_retaddr,(double)in_RDI,in_RSI,(double)in_RDI);
  return in_RDI;
}

Assistant:

Direction Direction::reverse() const
    {
        return Direction(-this->m_data[0],
                         -this->m_data[1],
                         -this->m_data[2]);
    }